

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O1

void __thiscall
google::protobuf::util::StatusOr<double>::StatusOr(StatusOr<double> *this,Status *status)

{
  StringPiece error_message;
  Status local_40;
  
  Status::Status(&this->status_);
  if (status->error_code_ == OK) {
    error_message.length_ = 0x23;
    error_message.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_40,INTERNAL,error_message);
    Status::operator=(&this->status_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.error_message_._M_dataplus._M_p != &local_40.error_message_.field_2) {
      operator_delete(local_40.error_message_._M_dataplus._M_p);
    }
  }
  else {
    Status::operator=(&this->status_,status);
  }
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const Status& status) {
  if (status.ok()) {
    status_ = Status(error::INTERNAL, "Status::OK is not a valid argument.");
  } else {
    status_ = status;
  }
}